

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeLocation.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::XIncludeLocation::prependPath(XIncludeLocation *this,XMLCh *baseToAdd)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLCh *src;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLSize_t hrefPathLength;
  XMLCh *hrefPath;
  int lastSlash;
  XMLSize_t baseLength;
  XMLCh *relativeHref;
  XMLCh *baseToAdd_local;
  XIncludeLocation *this_local;
  XMLCh *target;
  
  if (this->fHref == (XMLCh *)0x0) {
    this_local = (XIncludeLocation *)0x0;
  }
  else if (baseToAdd == (XMLCh *)0x0) {
    this_local = (XIncludeLocation *)this->fHref;
  }
  else {
    XMLPlatformUtils::removeDotDotSlash(baseToAdd,XMLPlatformUtils::fgMemoryManager);
    XVar2 = XMLString::stringLen(baseToAdd);
    hrefPath._4_4_ = XMLString::lastIndexOf(baseToAdd,L'/');
    if (hrefPath._4_4_ == -1) {
      hrefPath._4_4_ = XMLString::lastIndexOf(baseToAdd,L'\\');
    }
    src = findEndOfProtocol(this->fHref);
    XVar3 = XMLString::stringLen(src);
    iVar1 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                      (XMLPlatformUtils::fgMemoryManager,(XVar3 + XVar2 + 2) * 2);
    target = (XMLCh *)CONCAT44(extraout_var,iVar1);
    if (target == (XMLCh *)0x0) {
      this_local = (XIncludeLocation *)0x0;
    }
    else {
      XMLString::copyNString(target,baseToAdd,(long)(hrefPath._4_4_ + 1));
      target[hrefPath._4_4_ + 1] = L'\0';
      XMLString::catString(target,src);
      deallocate(this->fHref);
      this->fHref = target;
      this_local = (XIncludeLocation *)this->fHref;
    }
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh *
XIncludeLocation::prependPath(const XMLCh *baseToAdd){
    XMLCh *relativeHref = NULL;
    if (fHref == NULL){
        return NULL;
    }

    if (baseToAdd == NULL){
        return fHref;
    }

    XMLPlatformUtils::removeDotDotSlash((XMLCh*)baseToAdd);
    XMLSize_t baseLength = XMLString::stringLen(baseToAdd);

    int lastSlash = XMLString::lastIndexOf(baseToAdd, chForwardSlash);
    if (lastSlash == -1){
        /* not found, try another platform */
        lastSlash = XMLString::lastIndexOf(baseToAdd, chBackSlash);
    }

    // Skip the scheme (e.g., file://) if fHref has one. Ideally we
    // should detect also if the URI is absolute.
    //
    const XMLCh* hrefPath = findEndOfProtocol (fHref);
    XMLSize_t hrefPathLength = XMLString::stringLen(hrefPath);

    relativeHref = (XMLCh *)XMLPlatformUtils::fgMemoryManager->allocate((hrefPathLength + baseLength + 2) * sizeof(XMLCh));
    if (relativeHref == NULL){
        return NULL;
    }
    XMLString::copyNString(relativeHref, baseToAdd, lastSlash + 1);
    relativeHref[lastSlash + 1] = chNull;
    XMLString::catString(relativeHref, hrefPath);

    /* free the old reference */
    deallocate((void *)fHref);

    fHref = relativeHref;
    return fHref;
}